

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O0

int Gia_ManBmciTest(Gia_Man_t *p,Vec_Int_t *vInit,int nFrames,int nWords,int nTimeOut,int fSim,
                   int fVerbose)

{
  int nSize;
  Vec_Int_t *vInit1;
  Vec_Int_t *vInit0;
  int fSim_local;
  int nTimeOut_local;
  int nWords_local;
  int nFrames_local;
  Vec_Int_t *vInit_local;
  Gia_Man_t *p_local;
  
  nSize = Gia_ManRegNum(p);
  vInit1 = Vec_IntStart(nSize);
  Bmc_BmciPerform(p,vInit,vInit1,nFrames,nWords,nTimeOut,fVerbose);
  Vec_IntFree(vInit1);
  return 1;
}

Assistant:

int Gia_ManBmciTest( Gia_Man_t * p, Vec_Int_t * vInit, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose )
{
    Vec_Int_t * vInit0 = Vec_IntStart( Gia_ManRegNum(p) );
    Bmc_BmciPerform( p, vInit, vInit0, nFrames, nWords, nTimeOut, fVerbose );
    Vec_IntFree( vInit0 );
    return 1;
}